

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall
TArray<FSplashDef,_FSplashDef>::Push(TArray<FSplashDef,_FSplashDef> *this,FSplashDef *item)

{
  uint uVar1;
  FSplashDef *item_local;
  TArray<FSplashDef,_FSplashDef> *this_local;
  
  Grow(this,1);
  FSplashDef::FSplashDef(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}